

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_check_collapse.cpp
# Opt level: O3

Read<signed_char> __thiscall
Omega_h::check_collapse_exposure
          (Omega_h *this,Mesh *mesh,LOs *cands2edges,Read<signed_char> *cand_codes)

{
  int *piVar1;
  Alloc *this_00;
  Alloc *pAVar2;
  Alloc *this_01;
  Mesh *pMVar3;
  Omega_h_Parting OVar4;
  uint uVar5;
  undefined8 uVar6;
  char *pcVar7;
  void *extraout_RDX;
  void *extraout_RDX_00;
  int cell_dim;
  char *pcVar9;
  Read<signed_char> RVar10;
  LOs local_98;
  Alloc *local_88;
  void *local_80;
  Read<signed_char> local_78;
  LOs local_68;
  Alloc *local_58;
  void *pvStack_50;
  Mesh *local_40;
  LOs *local_38;
  void *pvVar8;
  
  local_40 = (Mesh *)this;
  OVar4 = Mesh::parting(mesh);
  if (OVar4 == OMEGA_H_GHOSTED) {
    uVar5 = mesh->dim_;
    if (uVar5 < 4) {
      cell_dim = 2;
      local_38 = cands2edges;
      do {
        pMVar3 = local_40;
        if ((int)uVar5 < cell_dim) {
          local_98.write_.shared_alloc_.alloc = (cand_codes->write_).shared_alloc_.alloc;
          if (((ulong)local_98.write_.shared_alloc_.alloc & 7) == 0 &&
              local_98.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_98.write_.shared_alloc_.alloc =
                   (Alloc *)((local_98.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_98.write_.shared_alloc_.alloc)->use_count =
                   (local_98.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_98.write_.shared_alloc_.direct_ptr = (cand_codes->write_).shared_alloc_.direct_ptr;
          local_88 = (cands2edges->write_).shared_alloc_.alloc;
          if (((ulong)local_88 & 7) == 0 && local_88 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_88 = (Alloc *)(local_88->size * 8 + 1);
            }
            else {
              local_88->use_count = local_88->use_count + 1;
            }
          }
          local_80 = (cands2edges->write_).shared_alloc_.direct_ptr;
          RVar10 = Mesh::sync_subset_array<signed_char>
                             (local_40,(Int)mesh,(Read<signed_char> *)0x1,&local_98,(char)&local_88,
                              0);
          pAVar2 = local_88;
          pvVar8 = RVar10.write_.shared_alloc_.direct_ptr;
          if (((ulong)local_88 & 7) == 0 && local_88 != (Alloc *)0x0) {
            piVar1 = &local_88->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_88);
              operator_delete(pAVar2,0x48);
              pvVar8 = extraout_RDX;
            }
          }
          pAVar2 = local_98.write_.shared_alloc_.alloc;
          if (((ulong)local_98.write_.shared_alloc_.alloc & 7) == 0 &&
              local_98.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_98.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_98.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
              pvVar8 = extraout_RDX_00;
            }
          }
          RVar10.write_.shared_alloc_.direct_ptr = pvVar8;
          RVar10.write_.shared_alloc_.alloc = (Alloc *)pMVar3;
          return (Read<signed_char>)RVar10.write_.shared_alloc_;
        }
        local_68.write_.shared_alloc_.alloc = (cands2edges->write_).shared_alloc_.alloc;
        if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
            local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_68.write_.shared_alloc_.alloc =
                 (Alloc *)((local_68.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_68.write_.shared_alloc_.alloc)->use_count =
                 (local_68.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        pAVar2 = local_68.write_.shared_alloc_.alloc;
        local_68.write_.shared_alloc_.direct_ptr = (cands2edges->write_).shared_alloc_.direct_ptr;
        local_78.write_.shared_alloc_.alloc = (cand_codes->write_).shared_alloc_.alloc;
        if (((ulong)local_78.write_.shared_alloc_.alloc & 7) == 0 &&
            local_78.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_78.write_.shared_alloc_.alloc =
                 (Alloc *)((local_78.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_78.write_.shared_alloc_.alloc)->use_count =
                 (local_78.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        this_01 = local_78.write_.shared_alloc_.alloc;
        local_78.write_.shared_alloc_.direct_ptr = (cand_codes->write_).shared_alloc_.direct_ptr;
        check_collapse_exposure((Omega_h *)&local_58,mesh,&local_68,&local_78,cell_dim);
        this_00 = (cand_codes->write_).shared_alloc_.alloc;
        if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
          piVar1 = &this_00->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(this_00);
            operator_delete(this_00,0x48);
          }
        }
        (cand_codes->write_).shared_alloc_.alloc = local_58;
        (cand_codes->write_).shared_alloc_.direct_ptr = pvStack_50;
        if ((((ulong)local_58 & 7) == 0 && local_58 != (Alloc *)0x0) &&
           (entering_parallel == '\x01')) {
          local_58->use_count = local_58->use_count + -1;
          (cand_codes->write_).shared_alloc_.alloc = (Alloc *)(local_58->size * 8 + 1);
        }
        local_58 = (Alloc *)0x0;
        pvStack_50 = (void *)0x0;
        if (((ulong)this_01 & 7) == 0 && this_01 != (Alloc *)0x0) {
          piVar1 = &this_01->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(this_01);
            operator_delete(this_01,0x48);
          }
        }
        cands2edges = local_38;
        if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
          piVar1 = &pAVar2->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(pAVar2);
            operator_delete(pAVar2,0x48);
          }
        }
        cell_dim = cell_dim + 1;
        uVar5 = mesh->dim_;
      } while (uVar5 < 4);
    }
    pcVar9 = "0 <= dim_ && dim_ <= 3";
    pcVar7 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
    ;
    uVar6 = 0x33;
  }
  else {
    pcVar9 = "mesh->parting() == OMEGA_H_GHOSTED";
    pcVar7 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_check_collapse.cpp"
    ;
    uVar6 = 0x6e;
  }
  fail("assertion %s failed at %s +%d\n",pcVar9,pcVar7,uVar6);
}

Assistant:

Read<I8> check_collapse_exposure(
    Mesh* mesh, LOs cands2edges, Read<I8> cand_codes) {
  OMEGA_H_CHECK(mesh->parting() == OMEGA_H_GHOSTED);
  for (Int cell_dim = Int(EDGE) + 1; cell_dim <= mesh->dim(); ++cell_dim) {
    cand_codes =
        check_collapse_exposure(mesh, cands2edges, cand_codes, cell_dim);
  }
  return mesh->sync_subset_array(
      EDGE, cand_codes, cands2edges, I8(DONT_COLLAPSE), 1);
}